

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  uint *result_data;
  uint *rdata;
  uint *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  puVar3 = ConstantVector::GetData<unsigned_int>((Vector *)0x210bb84);
  puVar4 = ConstantVector::GetData<unsigned_int>((Vector *)0x210bb93);
  puVar5 = ConstantVector::GetData<unsigned_int>((Vector *)0x210bba2);
  bVar1 = ConstantVector::IsNull((Vector *)0x210bbb1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x210bbbf), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    uVar2 = *puVar3;
    uVar6 = *puVar4;
    ConstantVector::Validity(in_RDX);
    uVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseXOROperator,unsigned_int,unsigned_int,unsigned_int>
                      (SUB81((ulong)puVar4 >> 0x38,0),(uint)puVar4,(uint)((ulong)puVar5 >> 0x20),
                       (ValidityMask *)CONCAT44(uVar7,uVar6),
                       CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    *puVar5 = uVar2;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}